

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O0

void __thiscall indk::NeuralNet::doInterlinkSyncStructure(NeuralNet *this)

{
  Interlink *this_00;
  bool bVar1;
  string local_30;
  NeuralNet *local_10;
  NeuralNet *this_local;
  
  if ((this->InterlinkService != (Interlink *)0x0) &&
     ((local_10 = this, this->InterlinkService == (Interlink *)0x0 ||
      (bVar1 = Interlink::isInterlinked(this->InterlinkService), bVar1)))) {
    this_00 = this->InterlinkService;
    getStructure_abi_cxx11_(&local_30,this,true);
    Interlink::doUpdateStructure(this_00,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void indk::NeuralNet::doInterlinkSyncStructure() {
    if (!InterlinkService || InterlinkService && !InterlinkService->isInterlinked()) return;
    InterlinkService -> doUpdateStructure(getStructure());
}